

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O0

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::level_of(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           *this,size_t node_idx)

{
  const_reference prVar1;
  const_reference puVar2;
  size_t local_20;
  size_t level;
  size_t node_idx_local;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *this_local;
  
  local_20 = 0;
  level = node_idx;
  while( true ) {
    prVar1 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(&this->tree_,level);
    if (((prVar1->is_leaf ^ 0xffU) & 1) == 0) break;
    local_20 = local_20 + 1;
    prVar1 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(&this->tree_,level);
    puVar2 = boost::container::
             vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             ::front(&(prVar1->entry).
                      super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                    );
    level = *puVar2;
  }
  return local_20;
}

Assistant:

std::size_t level_of(std::size_t node_idx) const
    {
        std::size_t level = 0;
        while(!(tree_.at(node_idx).is_leaf))
        {
            ++level;
            node_idx = tree_.at(node_idx).entry.front();
        }
        return level;
    }